

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

bool __thiscall MockNamedValue::compatibleForCopying(MockNamedValue *this,MockNamedValue *p)

{
  bool bVar1;
  bool bVar2;
  SimpleString local_40;
  SimpleString local_30;
  
  bVar1 = operator==(&this->type_,&p->type_);
  bVar2 = true;
  if (!bVar1) {
    SimpleString::SimpleString(&local_30,"const void*");
    bVar1 = operator==(&this->type_,&local_30);
    if (bVar1) {
      SimpleString::SimpleString(&local_40,"void*");
      bVar2 = operator==(&p->type_,&local_40);
      SimpleString::~SimpleString(&local_40);
    }
    else {
      bVar2 = false;
    }
    SimpleString::~SimpleString(&local_30);
  }
  return bVar2;
}

Assistant:

bool MockNamedValue::compatibleForCopying(const MockNamedValue& p) const
{
    if (type_ == p.type_) return true;

    if ((type_ == "const void*") && (p.type_ == "void*"))
        return true;

    return false;
}